

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void avro::parsing::SimpleParser<avro::parsing::DummyHandler>::assertLessThan(size_t n,size_t s)

{
  ostream *poVar1;
  Exception *this;
  string sStack_1b8;
  ostringstream oss;
  
  if (n < s) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Size max value. Upper bound: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," found ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  this = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this,&sStack_1b8);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void assertLessThan(size_t n, size_t s) {
        if (n >= s) {
            std::ostringstream oss;
            oss << "Size max value. Upper bound: " << s << " found " << n;
            throw Exception(oss.str());
        }
    }